

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_impls.cxx
# Opt level: O0

void __thiscall
dummy_state_machine::commit
          (dummy_state_machine *this,ulong param_2,buffer *data,uptr<log_entry_cookie> *param_4)

{
  ostream *poVar1;
  byte *pbVar2;
  buffer *in_RDX;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"commit message:");
  pbVar2 = cornerstone::buffer::data(in_RDX);
  poVar1 = std::operator<<(poVar1,(char *)pbVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

virtual void commit(const ulong, buffer& data, const uptr<log_entry_cookie>&)
    {
        std::cout << "commit message:" << reinterpret_cast<const char*>(data.data()) << std::endl;
    }